

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O1

int GMRES<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,TPZFMatrix<double>,double>
              (TPZMatrix<double> *A,TPZFMatrix<double> *x,TPZFMatrix<double> *b,
              TPZMatrixSolver<double> *M,TPZFMatrix<double> *H,int *m,int64_t *max_iter,double *tol,
              TPZFMatrix<double> *residual,int FromCurrent)

{
  TPZFMatrix<double> *v;
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong *puVar8;
  TPZFMatrix<double> *pTVar9;
  long lVar10;
  ostream *poVar11;
  bool bVar12;
  long lVar13;
  int iVar14;
  TPZFMatrix<double> *A_00;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  long lVar20;
  TPZFMatrix<double> *pTVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  TPZFMatrix<double> s;
  TPZFMatrix<double> sn;
  TPZFMatrix<double> cs;
  double local_408;
  double local_3e0;
  long local_3d0;
  long local_3c8;
  TPZFMatrix<double> local_390;
  TPZFMatrix<double> local_300;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  iVar14 = *m;
  lVar16 = (long)iVar14 + 1;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_390.fElem = (double *)0x0;
  local_390.fGiven = (double *)0x0;
  local_390.fSize = 0;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_390.fWork.fStore = (double *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar17 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar17 = lVar16 * 8;
    }
    local_390.fElem = (double *)operator_new__(uVar17);
  }
  iVar14 = *m;
  lVar16 = (long)iVar14 + 1;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_270.fElem = (double *)0x0;
  local_270.fGiven = (double *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_270.fWork.fStore = (double *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar17 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar17 = lVar16 * 8;
    }
    local_270.fElem = (double *)operator_new__(uVar17);
  }
  iVar14 = *m;
  lVar16 = (long)iVar14 + 1;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_300.fElem = (double *)0x0;
  local_300.fGiven = (double *)0x0;
  local_300.fSize = 0;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_300.fWork.fStore = (double *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar17 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar17 = lVar16 * 8;
    }
    local_300.fElem = (double *)operator_new__(uVar17);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1e0.fElem = (double *)0x0;
  local_1e0.fGiven = (double *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  A_00 = residual;
  if (residual == (TPZFMatrix<double> *)0x0) {
    A_00 = &local_c0;
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,A_00,0);
  dVar23 = Dot<double>(A_00,A_00);
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
    TPZFMatrix<double>::operator=(A_00,b);
  }
  else {
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (0xbff0000000000000,A,x,b,A_00,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,&local_1e0,0);
  TPZFMatrix<double>::operator=(A_00,&local_1e0);
  local_3e0 = Dot<double>(A_00,A_00);
  if (local_3e0 < 0.0) {
    local_3e0 = sqrt(local_3e0);
  }
  else {
    local_3e0 = SQRT(local_3e0);
  }
  local_408 = Dot<double>(A_00,A_00);
  dVar23 = (double)(~-(ulong)(dVar23 == 0.0) & (ulong)dVar23 |
                   -(ulong)(dVar23 == 0.0) & 0x3ff0000000000000);
  if (local_408 < 0.0) {
    local_408 = sqrt(local_408);
  }
  else {
    local_408 = SQRT(local_408);
  }
  local_408 = local_408 / dVar23;
  if (*tol < local_408) {
    iVar14 = *m;
    uVar15 = (ulong)(iVar14 + 1);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar15;
    uVar17 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x90),8) == 0) {
      uVar17 = SUB168(auVar7 * ZEXT816(0x90),0) | 8;
    }
    puVar8 = (ulong *)operator_new__(uVar17);
    *puVar8 = uVar15;
    if (iVar14 + 1 != 0) {
      lVar16 = 0;
      puVar18 = puVar8;
      do {
        puVar18[2] = 0;
        puVar18[3] = 0;
        *(undefined2 *)(puVar18 + 4) = 0;
        puVar18[1] = (ulong)&PTR__TPZFMatrix_0183c898;
        puVar18[5] = 0;
        puVar18[6] = 0;
        puVar18[7] = 0;
        TPZVec<int>::TPZVec((TPZVec<int> *)(puVar18 + 8),0);
        puVar18[8] = (ulong)&PTR__TPZManVector_0183cde8;
        puVar18[9] = (ulong)(puVar18 + 0xc);
        puVar18[10] = 0;
        puVar18[0xb] = 0;
        puVar18[0xf] = (ulong)&PTR__TPZVec_0183b4b0;
        puVar18[0x10] = 0;
        puVar18[0x11] = 0;
        puVar18[0x12] = 0;
        lVar16 = lVar16 + -0x90;
        puVar18 = puVar18 + 0x12;
      } while (-lVar16 != uVar15 * 0x90);
    }
    v = (TPZFMatrix<double> *)(puVar8 + 1);
    pTVar9 = &local_c0;
    if (residual != (TPZFMatrix<double> *)0x0) {
      pTVar9 = residual;
    }
    lVar16 = 1;
    do {
      if (*max_iter < lVar16) {
        *tol = local_408;
        uVar17 = *puVar8;
        if (uVar17 != 0) {
          lVar16 = uVar17 * 0x90;
          do {
            TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar8 + lVar16 + -0x88));
            lVar16 = lVar16 + -0x90;
          } while (lVar16 != 0);
        }
        operator_delete__(puVar8,uVar17 * 0x90 + 8);
        iVar14 = 1;
        break;
      }
      lVar20 = (pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      (*(v->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (v,lVar20,1);
      if (0 < lVar20) {
        pdVar4 = pTVar9->fElem;
        uVar17 = puVar8[5];
        lVar13 = 0;
        do {
          *(double *)(uVar17 + lVar13 * 8) = pdVar4[lVar13] * (1.0 / local_3e0);
          lVar13 = lVar13 + 1;
        } while (lVar20 != lVar13);
      }
      if (0 < local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
        memset(local_390.fElem,0,local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow << 3);
      }
      *local_390.fElem = local_3e0;
      bVar12 = *max_iter < lVar16 || *m < 1;
      if (*max_iter >= lVar16 && *m >= 1) {
        local_3c8 = 1;
        lVar13 = 0;
        lVar20 = 0;
        local_3d0 = lVar16;
LAB_00c5c567:
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
                  (A,v + lVar20,&local_150,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_150,&local_1e0,0);
        lVar16 = 0;
        pTVar21 = v;
        do {
          dVar24 = Dot<double>(&local_1e0,pTVar21);
          if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
             ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          *(double *)((long)H->fElem + lVar16 * 8 + lVar13 * lVar5) = dVar24;
          if ((lVar5 <= lVar16) || ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)
             ) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          TPZFMatrix<double>::ZAXPY
                    (&local_1e0,
                     -*(double *)
                       ((long)H->fElem +
                       lVar16 * 8 + (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13),
                     pTVar21);
          lVar16 = lVar16 + 1;
          pTVar21 = pTVar21 + 1;
        } while (local_3c8 != lVar16);
        dVar24 = Dot<double>(&local_1e0,&local_1e0);
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        lVar5 = lVar20 + 1;
        if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        H->fElem[(H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar20 + lVar5] = dVar24;
        pTVar21 = v + lVar5;
        TPZFMatrix<double>::operator=(pTVar21,&local_1e0);
        if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (*(pTVar21->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x26])(1.0 / H->fElem[(H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar20 +
                                 lVar5],pTVar21);
        if (lVar20 != 0) {
          lVar16 = 0;
          do {
            if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
               ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar22 = lVar16 + 1;
            lVar10 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar19 = lVar13 * lVar10;
            pdVar4 = H->fElem;
            if ((lVar10 <= lVar22) ||
               ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13;
            dVar24 = local_270.fElem[lVar16];
            dVar1 = *(double *)((long)pdVar4 + lVar16 * 8 + lVar19);
            dVar2 = local_300.fElem[lVar16];
            dVar3 = *(double *)((long)H->fElem + lVar16 * 8 + lVar10 + 8);
            *(double *)((long)H->fElem + lVar16 * 8 + lVar10 + 8) = dVar24 * dVar3 - dVar2 * dVar1;
            *(double *)((long)pdVar4 + lVar16 * 8 + lVar19) = dVar24 * dVar1 + dVar2 * dVar3;
            lVar16 = lVar22;
          } while (lVar20 != lVar22);
        }
        if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar20) ||
           ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar16 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar16 <= lVar5) || ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20))
        {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        GeneratePlaneRotation<double>
                  (H->fElem + lVar16 * lVar20 + lVar20,
                   H->fElem + (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar20 + lVar5
                   ,local_270.fElem + lVar20,local_300.fElem + lVar20);
        if (((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar20) ||
           ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar16 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar22 = lVar16 * lVar20;
        pdVar4 = H->fElem;
        if ((lVar16 <= lVar5) || ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar20))
        {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar16 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar20;
        dVar24 = local_270.fElem[lVar20];
        dVar1 = pdVar4[lVar22 + lVar20];
        dVar2 = local_300.fElem[lVar20];
        dVar3 = H->fElem[lVar16 + lVar5];
        H->fElem[lVar16 + lVar5] = dVar24 * dVar3 - dVar2 * dVar1;
        pdVar4[lVar22 + lVar20] = dVar24 * dVar1 + dVar2 * dVar3;
        dVar24 = local_390.fElem[lVar20] * -local_300.fElem[lVar20] +
                 local_390.fElem[lVar5] * local_270.fElem[lVar20];
        local_390.fElem[lVar20] =
             local_390.fElem[lVar20] * local_270.fElem[lVar20] +
             local_390.fElem[lVar5] * local_300.fElem[lVar20];
        (local_390.fElem + lVar20)[1] = dVar24;
        local_408 = ABS(dVar24) / dVar23;
        if (*tol <= local_408) goto code_r0x00c5ca7c;
        Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,lVar20,H,&local_390,v);
        *tol = local_408;
        *max_iter = local_3d0;
        uVar17 = *puVar8;
        if (uVar17 != 0) {
          lVar16 = uVar17 * 0x90;
          do {
            TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar8 + lVar16 + -0x88));
            lVar16 = lVar16 + -0x90;
          } while (lVar16 != 0);
        }
        operator_delete__(puVar8,uVar17 * 0x90 + 8);
        lVar16 = local_3d0;
      }
LAB_00c5cb4a:
      bVar6 = false;
      if (bVar12) {
        Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,(long)*m + -1,H,&local_390,v);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
                  (0xbff0000000000000,0x3ff0000000000000,A,x,b,A_00,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,A_00,0);
        local_3e0 = Dot<double>(A_00,A_00);
        if (local_3e0 < 0.0) {
          local_3e0 = sqrt(local_3e0);
        }
        else {
          local_3e0 = SQRT(local_3e0);
        }
        local_408 = local_3e0 / dVar23;
        bVar6 = true;
        if (local_408 < *tol) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter ",5);
          poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," - ",3);
          poVar11 = std::ostream::_M_insert<double>(local_408);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          *tol = local_408;
          *max_iter = lVar16;
          uVar17 = *puVar8;
          if (uVar17 != 0) {
            lVar20 = uVar17 * 0x90;
            do {
              TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar8 + lVar20 + -0x88))
              ;
              lVar20 = lVar20 + -0x90;
            } while (lVar20 != 0);
          }
          operator_delete__(puVar8,uVar17 * 0x90 + 8);
          bVar6 = false;
        }
      }
      iVar14 = 0;
    } while (bVar6);
  }
  else {
    *tol = local_408;
    TPZFMatrix<double>::operator+=(x,&A_00->super_TPZMatrix<double>);
    *max_iter = 0;
    iVar14 = 0;
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_300);
  TPZFMatrix<double>::~TPZFMatrix(&local_270);
  TPZFMatrix<double>::~TPZFMatrix(&local_390);
  return iVar14;
code_r0x00c5ca7c:
  lVar16 = local_3d0 + 1;
  bVar6 = *max_iter <= local_3d0;
  bVar12 = bVar6 || *m <= lVar5;
  local_3c8 = local_3c8 + 1;
  lVar13 = lVar13 + 8;
  lVar20 = lVar5;
  local_3d0 = lVar16;
  if (bVar6 || *m <= lVar5) goto LAB_00c5cb4a;
  goto LAB_00c5c567;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}